

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

size_t google::protobuf::internal::WireFormat::FieldByteSize
                 (FieldDescriptor *field,Message *message)

{
  bool bVar1;
  CppType CVar2;
  int size;
  Reflection *pRVar3;
  Descriptor *pDVar4;
  size_t sVar5;
  FieldDescriptor *in_RDI;
  size_t our_size;
  size_t data_size;
  size_t count;
  Reflection *message_reflection;
  Message *in_stack_00000140;
  FieldDescriptor *in_stack_00000148;
  Message *in_stack_ffffffffffffffc0;
  FieldDescriptor *in_stack_ffffffffffffffc8;
  Message *in_stack_ffffffffffffffd0;
  FieldDescriptor *this;
  Message *in_stack_ffffffffffffffd8;
  FieldDescriptor *local_8;
  
  pRVar3 = Message::GetReflection(in_stack_ffffffffffffffc0);
  bVar1 = FieldDescriptor::is_extension(in_RDI);
  if (bVar1) {
    pDVar4 = FieldDescriptor::containing_type(in_RDI);
    Descriptor::options(pDVar4);
    bVar1 = MessageOptions::message_set_wire_format((MessageOptions *)0x482847);
    if (((bVar1) &&
        (CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x482857), CVar2 == CPPTYPE_MESSAGE))
       && (bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x482866), !bVar1)) {
      sVar5 = MessageSetItemByteSize((FieldDescriptor *)pRVar3,in_stack_ffffffffffffffd8);
      return sVar5;
    }
  }
  pRVar3 = (Reflection *)0x0;
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x482896);
  if (bVar1) {
    size = Reflection::FieldSize((Reflection *)field,message,(FieldDescriptor *)message_reflection);
    pRVar3 = (Reflection *)FromIntSize(size);
  }
  else {
    pDVar4 = FieldDescriptor::containing_type(in_RDI);
    Descriptor::options(pDVar4);
    bVar1 = MessageOptions::map_entry((MessageOptions *)0x4828d8);
    if (bVar1) {
      pRVar3 = (Reflection *)0x1;
    }
    else {
      bVar1 = Reflection::HasField(pRVar3,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      if (bVar1) {
        pRVar3 = (Reflection *)0x1;
      }
    }
  }
  local_8 = (FieldDescriptor *)FieldDataOnlyByteSize(in_stack_00000148,in_stack_00000140);
  this = local_8;
  bVar1 = FieldDescriptor::is_packed(local_8);
  if (bVar1) {
    if (this != (FieldDescriptor *)0x0) {
      FieldDescriptor::number(in_RDI);
      sVar5 = TagSize((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),
                      (Type)in_stack_ffffffffffffffc0);
      local_8 = local_8 + sVar5;
      sVar5 = io::CodedOutputStream::VarintSize32(0);
      local_8 = local_8 + sVar5;
    }
  }
  else {
    FieldDescriptor::number(in_RDI);
    FieldDescriptor::type(this);
    sVar5 = TagSize((int)((ulong)pRVar3 >> 0x20),(Type)pRVar3);
    local_8 = local_8 + (long)pRVar3 * sVar5;
  }
  return (size_t)local_8;
}

Assistant:

size_t WireFormat::FieldByteSize(const FieldDescriptor* field,
                                 const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  if (field->is_extension() &&
      field->containing_type()->options().message_set_wire_format() &&
      field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      !field->is_repeated()) {
    return MessageSetItemByteSize(field, message);
  }

  size_t count = 0;
  if (field->is_repeated()) {
    count = FromIntSize(message_reflection->FieldSize(message, field));
  } else if (field->containing_type()->options().map_entry()) {
    // Map entry fields always need to be serialized.
    count = 1;
  } else if (message_reflection->HasField(message, field)) {
    count = 1;
  }

  const size_t data_size = FieldDataOnlyByteSize(field, message);
  size_t our_size = data_size;
  if (field->is_packed()) {
    if (data_size > 0) {
      // Packed fields get serialized like a string, not their native type.
      // Technically this doesn't really matter; the size only changes if it's
      // a GROUP
      our_size += TagSize(field->number(), FieldDescriptor::TYPE_STRING);
      our_size += io::CodedOutputStream::VarintSize32(data_size);
    }
  } else {
    our_size += count * TagSize(field->number(), field->type());
  }
  return our_size;
}